

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

void __thiscall Character::Refresh(Character *this)

{
  pointer *this_00;
  pointer *this_01;
  NPC *pNVar1;
  bool bVar2;
  int num;
  list<Character_*,_std::allocator<Character_*>_> *this_02;
  reference ppCVar3;
  vector<NPC_*,_std::allocator<NPC_*>_> *this_03;
  list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *this_04;
  reference psVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  reference ppCVar8;
  reference ppNVar9;
  reference psVar10;
  element_type *peVar11;
  undefined1 local_1a8 [8];
  shared_ptr<Map_Item> item_1;
  iterator __end1_5;
  iterator __begin1_5;
  vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *__range1_5;
  NPC *npc_1;
  iterator __end1_4;
  iterator __begin1_4;
  vector<NPC_*,_std::allocator<NPC_*>_> *__range1_4;
  string local_140;
  Character *local_120;
  Character *character_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<Character_*,_std::allocator<Character_*>_> *__range1_3;
  PacketBuilder builder;
  shared_ptr<Map_Item> item;
  iterator __end1_2;
  iterator __begin1_2;
  list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *__range1_2;
  NPC *npc;
  iterator __end1_1;
  iterator __begin1_1;
  vector<NPC_*,_std::allocator<NPC_*>_> *__range1_1;
  Character *local_78;
  Character *character;
  iterator __end1;
  iterator __begin1;
  list<Character_*,_std::allocator<Character_*>_> *__range1;
  vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> updateitems;
  vector<NPC_*,_std::allocator<NPC_*>_> updatenpcs;
  vector<Character_*,_std::allocator<Character_*>_> updatecharacters;
  Character *this_local;
  
  std::vector<Character_*,_std::allocator<Character_*>_>::vector
            ((vector<Character_*,_std::allocator<Character_*>_> *)
             &updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<NPC_*,_std::allocator<NPC_*>_>::vector
            ((vector<NPC_*,_std::allocator<NPC_*>_> *)
             &updateitems.
              super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::vector
            ((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
             &__range1);
  this_02 = &this->map->characters;
  __end1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(this_02);
  character = (Character *)
              std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(this_02);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&character), bVar2) {
    ppCVar3 = std::_List_iterator<Character_*>::operator*(&__end1);
    local_78 = *ppCVar3;
    bVar2 = InRange(this,local_78);
    if (bVar2) {
      std::vector<Character_*,_std::allocator<Character_*>_>::push_back
                ((vector<Character_*,_std::allocator<Character_*>_> *)
                 &updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_78);
    }
    std::_List_iterator<Character_*>::operator++(&__end1);
  }
  this_03 = &this->map->npcs;
  __end1_1 = std::vector<NPC_*,_std::allocator<NPC_*>_>::begin(this_03);
  npc = (NPC *)std::vector<NPC_*,_std::allocator<NPC_*>_>::end(this_03);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                             *)&npc), bVar2) {
    ppNVar9 = __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
              operator*(&__end1_1);
    __range1_2 = (list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
                 *ppNVar9;
    bVar2 = InRange(this,(NPC *)__range1_2);
    if ((bVar2) &&
       (((__range1_2->
         super__List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>).
         _M_impl._M_node._M_size & 1) != 0)) {
      std::vector<NPC_*,_std::allocator<NPC_*>_>::push_back
                ((vector<NPC_*,_std::allocator<NPC_*>_> *)
                 &updateitems.
                  super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&__range1_2);
    }
    __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::operator++
              (&__end1_1);
  }
  this_04 = &this->map->items;
  __end1_2 = std::__cxx11::
             list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::begin
                       (this_04);
  item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::__cxx11::list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
       end(this_04);
  while (bVar2 = std::operator!=(&__end1_2,
                                 (_Self *)&item.
                                           super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_refcount), bVar2) {
    psVar4 = std::_List_iterator<std::shared_ptr<Map_Item>_>::operator*(&__end1_2);
    std::shared_ptr<Map_Item>::shared_ptr((shared_ptr<Map_Item> *)&builder.add_size,psVar4);
    peVar11 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &builder.add_size);
    bVar2 = InRange(this,peVar11);
    if (bVar2) {
      std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::push_back
                ((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
                 &__range1,(value_type *)&builder.add_size);
    }
    std::shared_ptr<Map_Item>::~shared_ptr((shared_ptr<Map_Item> *)&builder.add_size);
    std::_List_iterator<std::shared_ptr<Map_Item>_>::operator++(&__end1_2);
  }
  sVar5 = std::vector<Character_*,_std::allocator<Character_*>_>::size
                    ((vector<Character_*,_std::allocator<Character_*>_> *)
                     &updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  sVar6 = std::vector<NPC_*,_std::allocator<NPC_*>_>::size
                    ((vector<NPC_*,_std::allocator<NPC_*>_> *)
                     &updateitems.
                      super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar7 = std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::size
                    ((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                      *)&__range1);
  PacketBuilder::PacketBuilder
            ((PacketBuilder *)&__range1_3,PACKET_REFRESH,PACKET_REPLY,
             sVar5 * 0x3c + sVar6 * 6 + 3 + sVar7 * 9);
  sVar5 = std::vector<Character_*,_std::allocator<Character_*>_>::size
                    ((vector<Character_*,_std::allocator<Character_*>_> *)
                     &updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(int)sVar5);
  PacketBuilder::AddByte((PacketBuilder *)&__range1_3,0xff);
  this_00 = &updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  __end1_3 = std::vector<Character_*,_std::allocator<Character_*>_>::begin
                       ((vector<Character_*,_std::allocator<Character_*>_> *)this_00);
  character_1 = (Character *)
                std::vector<Character_*,_std::allocator<Character_*>_>::end
                          ((vector<Character_*,_std::allocator<Character_*>_> *)this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_3,
                            (__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                             *)&character_1), bVar2) {
    ppCVar8 = __gnu_cxx::
              __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
              ::operator*(&__end1_3);
    local_120 = *ppCVar8;
    (*(local_120->super_Command_Source)._vptr_Command_Source[2])(&local_140);
    PacketBuilder::AddBreakString((PacketBuilder *)&__range1_3,&local_140,0xff);
    std::__cxx11::string::~string((string *)&local_140);
    num = PlayerID(local_120);
    PacketBuilder::AddShort((PacketBuilder *)&__range1_3,num);
    PacketBuilder::AddShort((PacketBuilder *)&__range1_3,(int)local_120->mapid);
    PacketBuilder::AddShort((PacketBuilder *)&__range1_3,(uint)local_120->x);
    PacketBuilder::AddShort((PacketBuilder *)&__range1_3,(uint)local_120->y);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)local_120->direction);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,6);
    PaddedGuildTag_abi_cxx11_((string *)&__range1_4,local_120);
    PacketBuilder::AddString((PacketBuilder *)&__range1_3,(string *)&__range1_4);
    std::__cxx11::string::~string((string *)&__range1_4);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)local_120->level);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)local_120->gender);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)local_120->hairstyle);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)local_120->haircolor);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)local_120->race);
    PacketBuilder::AddShort((PacketBuilder *)&__range1_3,local_120->maxhp);
    PacketBuilder::AddShort((PacketBuilder *)&__range1_3,local_120->hp);
    PacketBuilder::AddShort((PacketBuilder *)&__range1_3,local_120->maxtp);
    PacketBuilder::AddShort((PacketBuilder *)&__range1_3,local_120->tp);
    AddPaperdollData(local_120,(PacketBuilder *)&__range1_3,"B000A0HSW");
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)local_120->sitting);
    bVar2 = IsHideInvisible(local_120);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)bVar2);
    PacketBuilder::AddByte((PacketBuilder *)&__range1_3,0xff);
    __gnu_cxx::
    __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
    operator++(&__end1_3);
  }
  this_01 = &updateitems.
             super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1_4 = std::vector<NPC_*,_std::allocator<NPC_*>_>::begin
                       ((vector<NPC_*,_std::allocator<NPC_*>_> *)this_01);
  npc_1 = (NPC *)std::vector<NPC_*,_std::allocator<NPC_*>_>::end
                           ((vector<NPC_*,_std::allocator<NPC_*>_> *)this_01);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_4,
                            (__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                             *)&npc_1), bVar2) {
    ppNVar9 = __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
              operator*(&__end1_4);
    pNVar1 = *ppNVar9;
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)pNVar1->index);
    PacketBuilder::AddShort((PacketBuilder *)&__range1_3,pNVar1->id);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)pNVar1->x);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)pNVar1->y);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)pNVar1->direction);
    __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::operator++
              (&__end1_4);
  }
  PacketBuilder::AddByte((PacketBuilder *)&__range1_3,0xff);
  __end1_5 = std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
             begin((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *
                   )&__range1);
  item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::end
                 ((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
                  &__range1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_5,
                            (__normal_iterator<std::shared_ptr<Map_Item>_*,_std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>_>
                             *)&item_1.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount), bVar2) {
    psVar10 = __gnu_cxx::
              __normal_iterator<std::shared_ptr<Map_Item>_*,_std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>_>
              ::operator*(&__end1_5);
    std::shared_ptr<Map_Item>::shared_ptr((shared_ptr<Map_Item> *)local_1a8,psVar10);
    peVar11 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         local_1a8);
    PacketBuilder::AddShort((PacketBuilder *)&__range1_3,(int)peVar11->uid);
    peVar11 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         local_1a8);
    PacketBuilder::AddShort((PacketBuilder *)&__range1_3,(int)peVar11->id);
    peVar11 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         local_1a8);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)peVar11->x);
    peVar11 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         local_1a8);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)peVar11->y);
    peVar11 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         local_1a8);
    PacketBuilder::AddThree((PacketBuilder *)&__range1_3,peVar11->amount);
    std::shared_ptr<Map_Item>::~shared_ptr((shared_ptr<Map_Item> *)local_1a8);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Map_Item>_*,_std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>_>
    ::operator++(&__end1_5);
  }
  Send(this,(PacketBuilder *)&__range1_3);
  PacketBuilder::~PacketBuilder((PacketBuilder *)&__range1_3);
  std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::~vector
            ((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
             &__range1);
  std::vector<NPC_*,_std::allocator<NPC_*>_>::~vector
            ((vector<NPC_*,_std::allocator<NPC_*>_> *)
             &updateitems.
              super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<Character_*,_std::allocator<Character_*>_>::~vector
            ((vector<Character_*,_std::allocator<Character_*>_> *)
             &updatenpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Character::Refresh()
{
	std::vector<Character *> updatecharacters;
	std::vector<NPC *> updatenpcs;
	std::vector<std::shared_ptr<Map_Item>> updateitems;

	UTIL_FOREACH(this->map->characters, character)
	{
		if (this->InRange(character))
		{
			updatecharacters.push_back(character);
		}
	}

	UTIL_FOREACH(this->map->npcs, npc)
	{
		if (this->InRange(npc) && npc->alive)
		{
			updatenpcs.push_back(npc);
		}
	}

	UTIL_FOREACH(this->map->items, item)
	{
		if (this->InRange(*item))
		{
			updateitems.push_back(item);
		}
	}

	PacketBuilder builder(PACKET_REFRESH, PACKET_REPLY, 3 + updatecharacters.size() * 60 + updatenpcs.size() * 6 + updateitems.size() * 9);
	builder.AddChar(updatecharacters.size()); // Number of players
	builder.AddByte(255);

	UTIL_FOREACH(updatecharacters, character)
	{
		builder.AddBreakString(character->SourceName());
		builder.AddShort(character->PlayerID());
		builder.AddShort(character->mapid);
		builder.AddShort(character->x);
		builder.AddShort(character->y);
		builder.AddChar(character->direction);
		builder.AddChar(6); // ?
		builder.AddString(character->PaddedGuildTag());
		builder.AddChar(character->level);
		builder.AddChar(character->gender);
		builder.AddChar(character->hairstyle);
		builder.AddChar(character->haircolor);
		builder.AddChar(character->race);
		builder.AddShort(character->maxhp);
		builder.AddShort(character->hp);
		builder.AddShort(character->maxtp);
		builder.AddShort(character->tp);
		// equipment
		character->AddPaperdollData(builder, "B000A0HSW");

		builder.AddChar(character->sitting);
		builder.AddChar(character->IsHideInvisible());
		builder.AddByte(255);
	}

	UTIL_FOREACH(updatenpcs, npc)
	{
		builder.AddChar(npc->index);
		builder.AddShort(npc->id);
		builder.AddChar(npc->x);
		builder.AddChar(npc->y);
		builder.AddChar(npc->direction);
	}

	builder.AddByte(255);

	UTIL_FOREACH(updateitems, item)
	{
		builder.AddShort(item->uid);
		builder.AddShort(item->id);
		builder.AddChar(item->x);
		builder.AddChar(item->y);
		builder.AddThree(item->amount);
	}

	this->Send(builder);
}